

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::evaluateBatch(GridLocalPolynomial *this,double *x,int num_x,double *y)

{
  double dVar1;
  TypeAcceleration TVar2;
  AlgorithmPreference AVar3;
  int iVar4;
  uint uVar5;
  AccelerationContext *pAVar6;
  size_t sVar7;
  pointer pdVar8;
  double *pdVar9;
  size_t __n;
  long lVar10;
  ulong uVar11;
  pointer pdVar12;
  int iVar13;
  pointer piVar14;
  ulong uVar15;
  pointer piVar16;
  GpuVector<double> gpu_result;
  vector<double,_std::allocator<double>_> svals;
  vector<int,_std::allocator<int>_> spntr;
  GpuVector<double> gpu_x;
  allocator_type local_e9;
  vector<int,_std::allocator<int>_> local_e8;
  int *local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  size_t local_b0;
  pointer local_a8;
  pointer local_a0;
  double *local_98;
  ulong local_90;
  vector<int,_std::allocator<int>_> local_88;
  GpuVector<double> local_68;
  vector<double,_std::allocator<double>_> local_58;
  value_type_conflict2 local_38;
  
  pAVar6 = (this->super_BaseCanonicalGrid).acceleration;
  TVar2 = pAVar6->mode;
  if (TVar2 - accel_gpu_cuda < 2) {
    AccelerationMeta::setDefaultGpuDevice(pAVar6->device);
    if ((this->order != -1) && (num_x != 1 && this->order < 3)) {
      local_68.num_entries = 0;
      local_68.gpu_data = (double *)0x0;
      GpuVector<double>::load
                (&local_68,(this->super_BaseCanonicalGrid).acceleration,
                 (long)(this->super_BaseCanonicalGrid).num_dimensions * (long)num_x,x);
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      GpuVector<double>::resize
                ((GpuVector<double> *)&local_e8,(this->super_BaseCanonicalGrid).acceleration,
                 (long)(this->super_BaseCanonicalGrid).num_outputs * (long)num_x);
      (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x14])
                (this,local_68.gpu_data,(ulong)(uint)num_x,
                 local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      GpuVector<double>::unload
                ((GpuVector<double> *)&local_e8,(this->super_BaseCanonicalGrid).acceleration,
                 (size_t)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,y);
      GpuVector<double>::clear((GpuVector<double> *)&local_e8);
      GpuVector<double>::clear(&local_68);
      return;
    }
LAB_001762f8:
    evaluateGpuMixed(this,x,num_x,y);
    return;
  }
  if (TVar2 == accel_cpu_blas) {
    if ((pAVar6->algorithm_select != algorithm_sparse) &&
       ((pAVar6->algorithm_select != algorithm_autoselect ||
        (0x400 < (this->super_BaseCanonicalGrid).num_outputs)))) {
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      buildSpareBasisMatrix(this,x,num_x,0x20,&local_88,&local_e8,&local_c8);
      piVar16 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar13 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
      pdVar9 = (double *)(long)num_x;
      AVar3 = ((this->super_BaseCanonicalGrid).acceleration)->algorithm_select;
      if ((AVar3 == algorithm_dense) ||
         ((AVar3 == algorithm_autoselect &&
          (0.1 < (double)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pdVar9] /
                 ((double)iVar13 * (double)num_x))))) {
        local_38 = 0.0;
        local_68.num_entries = (long)iVar13;
        local_68.gpu_data = pdVar9;
        ::std::vector<double,_std::allocator<double>_>::vector
                  (&local_58,(long)iVar13 * (long)pdVar9,&local_38,&local_e9);
        if (0 < num_x) {
          uVar15 = 0;
          iVar13 = *piVar16;
          do {
            iVar4 = piVar16[uVar15 + 1];
            if (iVar13 < iVar4) {
              lVar10 = (long)iVar13;
              do {
                local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_68.num_entries * uVar15 +
                 (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10]] =
                     local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10];
                lVar10 = lVar10 + 1;
              } while (iVar4 != lVar10);
            }
            uVar15 = uVar15 + 1;
            iVar13 = iVar4;
          } while (uVar15 != (uint)num_x);
        }
        pdVar12 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
          pdVar12 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      else {
        pdVar12 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < num_x) {
          local_d0 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          uVar5 = (this->super_BaseCanonicalGrid).num_outputs;
          sVar7 = (this->surpluses).stride;
          pdVar8 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          __n = (long)(int)uVar5 * 8;
          local_90 = (ulong)(uint)num_x;
          uVar15 = 0;
          local_a0 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_a8 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar14 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_b0 = __n;
          local_98 = y;
          do {
            if (uVar5 != 0) {
              memset((double *)(__n * uVar15 + (long)local_98),0,__n);
              __n = local_b0;
              pdVar12 = local_a0;
              piVar14 = local_a8;
            }
            lVar10 = (long)local_d0[uVar15];
            iVar13 = local_d0[uVar15 + 1];
            if (local_d0[uVar15] < iVar13) {
              do {
                if (0 < (int)uVar5) {
                  iVar4 = piVar14[lVar10];
                  dVar1 = pdVar12[lVar10];
                  uVar11 = 0;
                  do {
                    y[uVar11] = pdVar8[(long)iVar4 * sVar7 + uVar11] * dVar1 + y[uVar11];
                    uVar11 = uVar11 + 1;
                  } while (uVar5 != uVar11);
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != iVar13);
            }
            uVar15 = uVar15 + 1;
            y = (double *)((long)y + __n);
            piVar16 = local_d0;
          } while (uVar15 != local_90);
        }
      }
      if (pdVar12 != (pointer)0x0) {
        operator_delete(pdVar12,(long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pdVar12);
      }
      operator_delete(piVar16,(long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage - (long)piVar16);
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
  }
  else if (TVar2 == accel_gpu_cublas) {
    AccelerationMeta::setDefaultGpuDevice(pAVar6->device);
    goto LAB_001762f8;
  }
  evaluateBatchOpenMP(this,x,num_x,y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateBatch(const double x[], int num_x, double y[]) const{
    switch(acceleration->mode){
        case accel_gpu_magma:
        case accel_gpu_cuda: {
            acceleration->setDevice();
            if ((order == -1) || (order > 2) || (num_x == 1)){
                // GPU evaluations are available only for order 0, 1, and 2. Cubic will come later, but higher order will not be supported.
                // cannot use GPU to accelerate the evaluation of a single vector
                evaluateGpuMixed(x, num_x, y);
                return;
            }
            GpuVector<double> gpu_x(acceleration, num_dimensions, num_x, x), gpu_result(acceleration, num_x, num_outputs);
            evaluateBatchGPU(gpu_x.data(), num_x, gpu_result.data());
            gpu_result.unload(acceleration, y);
            break;
        }
        case accel_gpu_cublas: {
            acceleration->setDevice();
            evaluateGpuMixed(x, num_x, y);
            break;
        }
        case accel_cpu_blas: {
            if (acceleration->algorithm_select == AccelerationContext::algorithm_sparse or
                (acceleration->algorithm_select == AccelerationContext::algorithm_autoselect and num_outputs <= 1024)){
                evaluateBatchOpenMP(x, num_x, y);
                return;
            }

            std::vector<int> sindx, spntr;
            std::vector<double> svals;
            buildSpareBasisMatrix(x, num_x, 32, spntr, sindx, svals); // build sparse matrix corresponding to x

            int num_points = points.getNumIndexes();
            double nnz = (double) spntr[num_x];
            double total_size = ((double) num_x) * ((double) num_points);

            if ((acceleration->algorithm_select == AccelerationContext::algorithm_dense)
                or ((acceleration->algorithm_select == AccelerationContext::algorithm_autoselect) and (nnz / total_size > 0.1))){
                // potentially wastes a lot of memory
                Data2D<double> A(num_points, num_x, 0.0);
                for(int i=0; i<num_x; i++){
                    double *row = A.getStrip(i);
                    for(int j=spntr[i]; j<spntr[i+1]; j++) row[sindx[j]] = svals[j];
                }
                TasBLAS::denseMultiply(num_outputs, num_x, num_points, 1.0, surpluses.getStrip(0), A.getStrip(0), 0.0, y);
            }else{
                Utils::Wrapper2D<double> ywrap(num_outputs, y);
                #pragma omp parallel for
                for(int i=0; i<num_x; i++){
                    double *this_y = ywrap.getStrip(i);
                    std::fill(this_y, this_y + num_outputs, 0.0);
                    for(int j=spntr[i]; j<spntr[i+1]; j++){
                        double v = svals[j];
                        const double *s = surpluses.getStrip(sindx[j]);
                        for(int k=0; k<num_outputs; k++) this_y[k] += v * s[k];
                    }
                }
            }
            break;
        }
        default: {
            evaluateBatchOpenMP(x, num_x, y);
            break;
        }
    }
}